

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall p2t::Sweep::FillBasin(Sweep *this,SweepContext *tcx,Node *node)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  Orientation OVar4;
  Node *node_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  OVar4 = Orient2d(node->point,node->next->point,node->next->next->point);
  if (OVar4 == CCW) {
    (tcx->basin).left_node = node->next->next;
  }
  else {
    (tcx->basin).left_node = node->next;
  }
  (tcx->basin).bottom_node = (tcx->basin).left_node;
  while( true ) {
    bVar3 = false;
    if (((tcx->basin).bottom_node)->next != (Node *)0x0) {
      bVar3 = ((tcx->basin).bottom_node)->next->point->y <= ((tcx->basin).bottom_node)->point->y;
    }
    if (!bVar3) break;
    (tcx->basin).bottom_node = ((tcx->basin).bottom_node)->next;
  }
  if ((tcx->basin).bottom_node != (tcx->basin).left_node) {
    (tcx->basin).right_node = (tcx->basin).bottom_node;
    while( true ) {
      bVar3 = false;
      if (((tcx->basin).right_node)->next != (Node *)0x0) {
        bVar3 = ((tcx->basin).right_node)->point->y < ((tcx->basin).right_node)->next->point->y;
      }
      if (!bVar3) break;
      (tcx->basin).right_node = ((tcx->basin).right_node)->next;
    }
    if ((tcx->basin).right_node != (tcx->basin).bottom_node) {
      (tcx->basin).width = ((tcx->basin).right_node)->point->x - ((tcx->basin).left_node)->point->x;
      dVar2 = ((tcx->basin).left_node)->point->y;
      pdVar1 = &((tcx->basin).right_node)->point->y;
      (tcx->basin).left_highest = *pdVar1 <= dVar2 && dVar2 != *pdVar1;
      FillBasinReq(this,tcx,(tcx->basin).bottom_node);
    }
  }
  return;
}

Assistant:

void Sweep::FillBasin(SweepContext& tcx, Node& node)
{
  if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
    tcx.basin.left_node = node.next->next;
  } else {
    tcx.basin.left_node = node.next;
  }

  // Find the bottom and right node
  tcx.basin.bottom_node = tcx.basin.left_node;
  while (tcx.basin.bottom_node->next
         && tcx.basin.bottom_node->point->y >= tcx.basin.bottom_node->next->point->y) {
    tcx.basin.bottom_node = tcx.basin.bottom_node->next;
  }
  if (tcx.basin.bottom_node == tcx.basin.left_node) {
    // No valid basin
    return;
  }

  tcx.basin.right_node = tcx.basin.bottom_node;
  while (tcx.basin.right_node->next
         && tcx.basin.right_node->point->y < tcx.basin.right_node->next->point->y) {
    tcx.basin.right_node = tcx.basin.right_node->next;
  }
  if (tcx.basin.right_node == tcx.basin.bottom_node) {
    // No valid basins
    return;
  }

  tcx.basin.width = tcx.basin.right_node->point->x - tcx.basin.left_node->point->x;
  tcx.basin.left_highest = tcx.basin.left_node->point->y > tcx.basin.right_node->point->y;

  FillBasinReq(tcx, tcx.basin.bottom_node);
}